

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_access.c
# Opt level: O2

void ecs_records_update(ecs_world_t *world,ecs_vector_t *entities,ecs_vector_t *records,
                       ecs_table_t *table)

{
  long lVar1;
  undefined8 *puVar2;
  uint uVar3;
  void *pvVar4;
  void *pvVar5;
  ecs_record_t *peVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar3 = ecs_vector_count(records);
  pvVar4 = _ecs_vector_first(entities,8,0x10);
  pvVar5 = _ecs_vector_first(records,8,0x10);
  uVar7 = 0;
  uVar8 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar8 = uVar7;
  }
  while( true ) {
    if (uVar8 == uVar7) {
      return;
    }
    peVar6 = ecs_record_ensure(world,*(ecs_entity_t *)((long)pvVar4 + uVar7 * 8));
    *(ecs_record_t **)((long)pvVar5 + uVar7 * 8) = peVar6;
    _ecs_assert(true,0xc,(char *)0x0,"r[i] != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/direct_access.c"
                ,0xd1);
    puVar2 = *(undefined8 **)((long)pvVar5 + uVar7 * 8);
    if (puVar2 == (undefined8 *)0x0) break;
    *puVar2 = table;
    lVar1 = uVar7 * 8;
    uVar7 = uVar7 + 1;
    *(int *)(*(long *)((long)pvVar5 + lVar1) + 8) = (int)uVar7;
  }
  __assert_fail("r[i] != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/direct_access.c"
                ,0xd1,
                "void ecs_records_update(ecs_world_t *, ecs_vector_t *, ecs_vector_t *, ecs_table_t *)"
               );
}

Assistant:

void ecs_records_update(
    ecs_world_t *world,
    ecs_vector_t *entities,
    ecs_vector_t *records,
    ecs_table_t *table)
{
    int32_t i, count = ecs_vector_count(records);
    ecs_entity_t *e = ecs_vector_first(entities, ecs_entity_t);
    ecs_record_t **r = ecs_vector_first(records, ecs_record_t*);

    for (i = 0; i < count; i ++) {
        r[i] = ecs_record_ensure(world, e[i]);
        ecs_assert(r[i] != NULL, ECS_INTERNAL_ERROR, NULL);

        r[i]->table = table;
        r[i]->row = i + 1;
    }    
}